

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

char * acutest_basename_(char *path)

{
  char *pcVar1;
  char *in_RDI;
  char *name;
  char *local_10;
  
  pcVar1 = strrchr(in_RDI,0x2f);
  local_10 = in_RDI;
  if (pcVar1 != (char *)0x0) {
    local_10 = pcVar1 + 1;
  }
  return local_10;
}

Assistant:

static const char*
acutest_basename_(const char* path)
{
    const char* name;

    name = strrchr(path, '/');
    if(name != NULL)
        name++;
    else
        name = path;

#ifdef ACUTEST_WIN_
    {
        const char* alt_name;

        alt_name = strrchr(path, '\\');
        if(alt_name != NULL)
            alt_name++;
        else
            alt_name = path;

        if(alt_name > name)
            name = alt_name;
    }
#endif

    return name;
}